

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_stdio.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  char *pcVar2;
  FILE *pFVar3;
  char *__new;
  runtime_error *prVar4;
  ostream *poVar5;
  exception *e;
  string local_1120 [32];
  ostringstream local_1100 [8];
  ostringstream ss_9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f88;
  undefined1 local_f61;
  string local_f60 [32];
  ostringstream local_f40 [8];
  ostringstream ss_8;
  string local_dc0 [32];
  ostringstream local_da0 [8];
  ostringstream ss_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c28;
  undefined1 local_c01;
  string local_c00 [32];
  ostringstream local_be0 [8];
  ostringstream ss_6;
  string local_a60 [32];
  ostringstream local_a40 [8];
  ostringstream ss_5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8c8;
  undefined1 local_8a1;
  string local_8a0 [32];
  ostringstream local_880 [8];
  ostringstream ss_4;
  string local_700 [32];
  ostringstream local_6e0 [8];
  ostringstream ss_3;
  string local_560 [32];
  ostringstream local_540 [8];
  ostringstream ss_2;
  char local_3c8 [8];
  char buf [16];
  string local_3b0 [32];
  ostringstream local_390 [8];
  ostringstream ss_1;
  string local_210 [32];
  ostringstream local_1f0 [8];
  ostringstream ss;
  FILE *f;
  wstring local_68 [8];
  wstring wexample;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string example;
  
  example.field_2._12_4_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_30,anon_var_dwarf_3b12,&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_68,L"ש-м-ν.txt",(allocator<wchar_t> *)((long)&f + 7));
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&f + 7));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"w");
  if (pFVar3 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_1f0);
    poVar5 = std::operator<<((ostream *)local_1f0,"Error f in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1e);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_210);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fprintf(pFVar3,"test\n");
  fclose(pFVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"r");
  if (pFVar3 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_390);
    poVar5 = std::operator<<((ostream *)local_390,
                             "Error (f=nowide::fopen(example.c_str(),\"r\"))!=0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x23);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    buf[0xf] = '\x01';
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_3b0);
    buf[0xf] = '\0';
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = fgets(local_3c8,0x10,pFVar3);
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_540);
    poVar5 = std::operator<<((ostream *)local_540,"Error std::fgets(buf,16,f)!=0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x25);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_560);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = strcmp(local_3c8,"test\n");
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_6e0);
    poVar5 = std::operator<<((ostream *)local_6e0,"Error strcmp(buf,\"test\\n\")==0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x26);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_700);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = freopen(pcVar2,"r+",pFVar3);
  if (pFVar3 == (FILE *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_880);
    poVar5 = std::operator<<((ostream *)local_880,
                             "Error (f=nowide::freopen(example.c_str(),\"r+\",f))!=0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x27);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    local_8a1 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_8a0);
    local_8a1 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  fclose(pFVar3);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::operator+(&local_8c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,".1")
  ;
  __new = (char *)std::__cxx11::string::c_str();
  iVar1 = rename(pcVar2,__new);
  std::__cxx11::string::~string((string *)&local_8c8);
  if (iVar1 != 0) {
    std::__cxx11::ostringstream::ostringstream(local_a40);
    poVar5 = std::operator<<((ostream *)local_a40,
                             "Error nowide::rename(example.c_str(),(example+\".1\").c_str())==0 in "
                            );
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2b);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_a60);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = remove(pcVar2);
  if (-1 < iVar1) {
    std::__cxx11::ostringstream::ostringstream(local_be0);
    poVar5 = std::operator<<((ostream *)local_be0,"Error nowide::remove(example.c_str())<0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2c);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    local_c01 = 1;
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_c00);
    local_c01 = 0;
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator+(&local_c28,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,".1")
  ;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pFVar3 = fopen(pcVar2,"r");
  std::__cxx11::string::~string((string *)&local_c28);
  if (pFVar3 != (FILE *)0x0) {
    fclose(pFVar3);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = remove(pcVar2);
    if (-1 < iVar1) {
      std::__cxx11::ostringstream::ostringstream(local_f40);
      poVar5 = std::operator<<((ostream *)local_f40,"Error nowide::remove(example.c_str())<0 in ");
      poVar5 = std::operator<<(poVar5,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                              );
      poVar5 = std::operator<<(poVar5,':');
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x30);
      poVar5 = std::operator<<(poVar5," ");
      std::operator<<(poVar5,"main");
      local_f61 = 1;
      prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::ostringstream::str();
      std::runtime_error::runtime_error(prVar4,local_f60);
      local_f61 = 0;
      __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::operator+(&local_f88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                   ".1");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = remove(pcVar2);
    std::__cxx11::string::~string((string *)&local_f88);
    if (iVar1 == 0) {
      std::__cxx11::wstring::~wstring(local_68);
      std::__cxx11::string::~string((string *)local_30);
      poVar5 = std::operator<<((ostream *)&std::cout,"Ok");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
      return 0;
    }
    std::__cxx11::ostringstream::ostringstream(local_1100);
    poVar5 = std::operator<<((ostream *)local_1100,
                             "Error nowide::remove((example+\".1\").c_str())==0 in ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                            );
    poVar5 = std::operator<<(poVar5,':');
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x31);
    poVar5 = std::operator<<(poVar5," ");
    std::operator<<(poVar5,"main");
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::ostringstream::str();
    std::runtime_error::runtime_error(prVar4,local_1120);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::ostringstream::ostringstream(local_da0);
  poVar5 = std::operator<<((ostream *)local_da0,
                           "Error (f=nowide::fopen((example+\".1\").c_str(),\"r\"))!=0 in ");
  poVar5 = std::operator<<(poVar5,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/OpenBoardView[P]nowide/test/test_stdio.cpp"
                          );
  poVar5 = std::operator<<(poVar5,':');
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2d);
  poVar5 = std::operator<<(poVar5," ");
  std::operator<<(poVar5,"main");
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(prVar4,local_dc0);
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int main()
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd.txt";
        std::wstring wexample = L"\u05e9-\u043c-\u03bd.txt";

        #ifdef NOWIDE_WINDOWS
        FILE *f=_wfopen(wexample.c_str(),L"w");
        #else
        FILE *f=std::fopen(example.c_str(),"w");
        #endif
        TEST(f);
        std::fprintf(f,"test\n");
        std::fclose(f);
        f=0;
        
        TEST((f=nowide::fopen(example.c_str(),"r"))!=0);
        char buf[16];
        TEST(std::fgets(buf,16,f)!=0);
        TEST(strcmp(buf,"test\n")==0);
        TEST((f=nowide::freopen(example.c_str(),"r+",f))!=0);
        std::fclose(f);
        f=0;
        
        TEST(nowide::rename(example.c_str(),(example+".1").c_str())==0);
        TEST(nowide::remove(example.c_str())<0);
        TEST((f=nowide::fopen((example+".1").c_str(),"r"))!=0);
        std::fclose(f);
        f=0;
        TEST(nowide::remove(example.c_str())<0);
        TEST(nowide::remove((example+".1").c_str())==0);
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
    std::cout << "Ok" << std::endl;
    return 0;
}